

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string_t *
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::escape_string(string_t *__return_storage_ptr__,string_t *s)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  string_t *__range2;
  char local_15 [5];
  
  sVar4 = extra_space(s);
  if (sVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + s->_M_string_length);
  }
  else {
    sVar2 = s->_M_string_length;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar4 + (char)sVar2);
    if (s->_M_string_length != 0) {
      pbVar6 = (byte *)(s->_M_dataplus)._M_p;
      pbVar5 = pbVar6 + s->_M_string_length;
      lVar7 = 0;
      do {
        bVar1 = *pbVar6;
        switch(bVar1) {
        case 8:
          (__return_storage_ptr__->_M_dataplus)._M_p[lVar7 + 1] = 'b';
          break;
        case 9:
          (__return_storage_ptr__->_M_dataplus)._M_p[lVar7 + 1] = 't';
          break;
        case 10:
          (__return_storage_ptr__->_M_dataplus)._M_p[lVar7 + 1] = 'n';
          break;
        case 0xb:
switchD_00120fdb_caseD_b:
          if (bVar1 < 0x20) {
            lVar8 = 0;
            do {
              (__return_storage_ptr__->_M_dataplus)._M_p[lVar8 + lVar7 + 1] = local_15[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 5);
            lVar7 = lVar7 + 6;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p[lVar7] = bVar1;
            lVar7 = lVar7 + 1;
          }
          goto LAB_00121092;
        case 0xc:
          (__return_storage_ptr__->_M_dataplus)._M_p[lVar7 + 1] = 'f';
          break;
        case 0xd:
          (__return_storage_ptr__->_M_dataplus)._M_p[lVar7 + 1] = 'r';
          break;
        default:
          if (bVar1 != 0x5c) {
            if (bVar1 != 0x22) goto switchD_00120fdb_caseD_b;
            (__return_storage_ptr__->_M_dataplus)._M_p[lVar7 + 1] = '\"';
          }
        }
        lVar7 = lVar7 + 2;
LAB_00121092:
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar5);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string_t escape_string(const string_t& s)
    {
        const auto space = extra_space(s);
        if (space == 0)
        {
            return s;
        }

        // create a result string of necessary size
        string_t result(s.size() + space, '\\');
        std::size_t pos = 0;

        for (const auto& c : s)
        {
            switch (c)
            {
                // quotation mark (0x22)
                case '"':
                {
                    result[pos + 1] = '"';
                    pos += 2;
                    break;
                }

                // reverse solidus (0x5c)
                case '\\':
                {
                    // nothing to change
                    pos += 2;
                    break;
                }

                // backspace (0x08)
                case '\b':
                {
                    result[pos + 1] = 'b';
                    pos += 2;
                    break;
                }

                // formfeed (0x0c)
                case '\f':
                {
                    result[pos + 1] = 'f';
                    pos += 2;
                    break;
                }

                // newline (0x0a)
                case '\n':
                {
                    result[pos + 1] = 'n';
                    pos += 2;
                    break;
                }

                // carriage return (0x0d)
                case '\r':
                {
                    result[pos + 1] = 'r';
                    pos += 2;
                    break;
                }

                // horizontal tab (0x09)
                case '\t':
                {
                    result[pos + 1] = 't';
                    pos += 2;
                    break;
                }

                default:
                {
                    if (c >= 0x00 and c <= 0x1f)
                    {
                        // convert a number 0..15 to its hex representation
                        // (0..f)
                        static const char hexify[16] =
                        {
                            '0', '1', '2', '3', '4', '5', '6', '7',
                            '8', '9', 'a', 'b', 'c', 'd', 'e', 'f'
                        };

                        // print character c as \uxxxx
                        for (const char m :
                    { 'u', '0', '0', hexify[c >> 4], hexify[c & 0x0f]
                        })
                        {
                            result[++pos] = m;
                        }

                        ++pos;
                    }
                    else
                    {
                        // all other characters are added as-is
                        result[pos++] = c;
                    }
                    break;
                }
            }
        }

        return result;
    }